

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

Status cmSystemTools::CreateSymlink(string *origName,string *newName)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Status status;
  Status local_b8;
  string local_b0;
  string local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  size_type local_28;
  pointer local_20;
  string *local_18;
  
  local_b8 = CreateSymlinkQuietly(origName,newName);
  if (local_b8.Kind_ != Success) {
    cmsys::Status::GetString_abi_cxx11_(&local_90,&local_b8);
    local_70.first._M_len = 0x20;
    local_70.first._M_str = "failed to create symbolic link \'";
    local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_50 = (newName->_M_dataplus)._M_p;
    local_58 = newName->_M_string_length;
    local_48 = 0;
    local_40 = 3;
    local_38 = "\': ";
    local_30 = 0;
    local_28 = local_90._M_string_length;
    local_20 = local_90._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = &local_70;
    local_18 = &local_90;
    cmCatViews(&local_b0,views);
    Error(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return local_b8;
}

Assistant:

cmsys::Status cmSystemTools::CreateSymlink(std::string const& origName,
                                           std::string const& newName)
{
  cmsys::Status status =
    cmSystemTools::CreateSymlinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(cmStrCat("failed to create symbolic link '", newName,
                                  "': ", status.GetString()));
  }
  return status;
}